

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

Vec_Wec_t * Gia_ManCreateSupps(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Vec_Wec_t *p_00;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vArr2;
  Vec_Int_t *vArr;
  abctime aVar4;
  bool bVar5;
  Vec_Wec_t *vSupps;
  int Id;
  int i;
  Gia_Obj_t *pObj;
  abctime clk;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_WecStart(iVar1);
  vSupps._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar5 = false;
    if (vSupps._4_4_ < iVar1) {
      pObj_00 = Gia_ManCi(p,vSupps._4_4_);
      vSupps._0_4_ = Gia_ObjId(p,pObj_00);
      bVar5 = (int)vSupps != 0;
    }
    if (!bVar5) break;
    pVVar3 = Vec_WecEntry(p_00,(int)vSupps);
    Vec_IntPush(pVVar3,vSupps._4_4_);
    vSupps._4_4_ = vSupps._4_4_ + 1;
  }
  vSupps._0_4_ = 0;
  while( true ) {
    bVar5 = false;
    if ((int)vSupps < p->nObjs) {
      _Id = Gia_ManObj(p,(int)vSupps);
      bVar5 = _Id != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_Id);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(_Id,(int)vSupps);
      pVVar3 = Vec_WecEntry(p_00,iVar1);
      iVar1 = Gia_ObjFaninId1(_Id,(int)vSupps);
      vArr2 = Vec_WecEntry(p_00,iVar1);
      vArr = Vec_WecEntry(p_00,(int)vSupps);
      Vec_IntTwoMerge2(pVVar3,vArr2,vArr);
    }
    vSupps._0_4_ = (int)vSupps + 1;
  }
  if (fVerbose != 0) {
    aVar4 = Abc_Clock();
    Abc_PrintTime(1,"Support computation",aVar4 - aVar2);
  }
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManCreateSupps( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
//    Gia_ManForEachCo( p, pObj, i )
//        Vec_IntAppend( Vec_WecEntry(vSupps, Gia_ObjId(p, pObj)), Vec_WecEntry(vSupps, Gia_ObjFaninId0p(p, pObj)) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSupps;
}